

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_schema_factory.hpp
# Opt level: O2

unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::get_factory(validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *sch,
             string_view *schema_id,evaluation_options *options,schema_store_type *schema_store_ptr,
             vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
             *resolve_funcs,
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             *vocabulary)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  undefined1 local_58 [8];
  pointer local_50;
  pointer local_48;
  
  *(undefined8 *)this = 0;
  __x._M_len = *(size_t *)&(options->default_version_)._M_dataplus;
  __x._M_str = (char *)(options->default_version_)._M_string_length;
  local_58 = (undefined1  [8])resolve_funcs;
  schema_version::draft202012_abi_cxx11_();
  __y._M_str = (char *)local_50;
  __y._M_len = (size_t)local_48;
  bVar1 = std::operator==(__x,__y);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  if (bVar1) {
    std::
    make_unique<jsoncons::jsonschema::draft202012::schema_validator_factory_202012<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&,std::unordered_map<std::__cxx11::string,bool,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>const&>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)(local_58 + 8),
               (validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)schema_id,(evaluation_options *)sch,
               (map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
                **)schema_store_ptr,
               (vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
                *)local_58,vocabulary);
  }
  else {
    __x_00._M_len = *(size_t *)&(options->default_version_)._M_dataplus;
    __x_00._M_str = (char *)(options->default_version_)._M_string_length;
    schema_version::draft201909_abi_cxx11_();
    __y_00._M_str = (char *)local_50;
    __y_00._M_len = (size_t)local_48;
    bVar1 = std::operator==(__x_00,__y_00);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    if (bVar1) {
      std::
      make_unique<jsoncons::jsonschema::draft201909::schema_validator_factory_201909<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&,std::unordered_map<std::__cxx11::string,bool,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>const&>
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)(local_58 + 8),
                 (validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)schema_id,(evaluation_options *)sch,
                 (map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
                  **)schema_store_ptr,
                 (vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
                  *)local_58,vocabulary);
    }
    else {
      __x_01._M_len = *(size_t *)&(options->default_version_)._M_dataplus;
      __x_01._M_str = (char *)(options->default_version_)._M_string_length;
      schema_version::draft7_abi_cxx11_();
      __y_01._M_str = (char *)local_50;
      __y_01._M_len = (size_t)local_48;
      bVar1 = std::operator==(__x_01,__y_01);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      if (bVar1) {
        std::
        make_unique<jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&>
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   (local_58 + 8),
                   (validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)schema_id,(evaluation_options *)sch,
                   (map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
                    **)schema_store_ptr,
                   (vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
                    *)local_58);
      }
      else {
        __x_02._M_len = *(size_t *)&(options->default_version_)._M_dataplus;
        __x_02._M_str = (char *)(options->default_version_)._M_string_length;
        schema_version::draft6_abi_cxx11_();
        __y_02._M_str = (char *)local_50;
        __y_02._M_len = (size_t)local_48;
        bVar1 = std::operator==(__x_02,__y_02);
        std::__cxx11::string::~string((string *)(local_58 + 8));
        if (bVar1) {
          std::
          make_unique<jsoncons::jsonschema::draft6::schema_validator_factory_6<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&>
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     (local_58 + 8),
                     (validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)schema_id,(evaluation_options *)sch,
                     (map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
                      **)schema_store_ptr,
                     (vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
                      *)local_58);
        }
        else {
          __x_03._M_len = *(size_t *)&(options->default_version_)._M_dataplus;
          __x_03._M_str = (char *)(options->default_version_)._M_string_length;
          schema_version::draft4_abi_cxx11_();
          __y_03._M_str = (char *)local_50;
          __y_03._M_len = (size_t)local_48;
          bVar1 = std::operator==(__x_03,__y_03);
          std::__cxx11::string::~string((string *)(local_58 + 8));
          if (bVar1) {
            std::
            make_unique<jsoncons::jsonschema::draft4::schema_validator_factory_4<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&>
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       (local_58 + 8),
                       (validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                        *)schema_id,(evaluation_options *)sch,
                       (map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
                        **)schema_store_ptr,
                       (vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
                        *)local_58);
          }
          else {
            get_factory_from_meta_schema
                      ((validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                        *)(local_58 + 8),sch,schema_id,options,schema_store_ptr,
                       (vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
                        *)local_58);
          }
        }
      }
    }
  }
  *(pointer *)this = local_50;
  return (__uniq_ptr_data<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(__uniq_ptr_data<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<schema_validator_factory_base<Json>> get_factory(Json&& sch, const jsoncons::string_view& schema_id,
            const evaluation_options& options, schema_store_type* schema_store_ptr,
            const std::vector<resolve_uri_type<Json>>& resolve_funcs,
            const std::unordered_map<std::string,bool>& vocabulary) const
        {
            std::unique_ptr<schema_validator_factory_base<Json>> factory;

            if (schema_id == schema_version::draft202012())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft202012::schema_validator_factory_202012<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs, vocabulary);
            }
            else if (schema_id == schema_version::draft201909())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft201909::schema_validator_factory_201909<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs, vocabulary);
            }
            else if (schema_id == schema_version::draft7())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft7::schema_validator_factory_7<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs);
            }
            else if (schema_id == schema_version::draft6())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft6::schema_validator_factory_6<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs);
            }
            else if (schema_id == schema_version::draft4())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft4::schema_validator_factory_4<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs);
            }
            else
            { 
                factory = get_factory_from_meta_schema(std::move(sch), schema_id, options, schema_store_ptr, resolve_funcs);
            }
            return factory;
        }